

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astMakeAssociationNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  anon_struct_24_3_0437a534 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_stackFrameRecord_t local_60;
  undefined8 local_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *local_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_78 = 0;
  sStack_70 = 0;
  local_68 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 3;
  local_30 = (undefined1 *)&local_78;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_60.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_60.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_50 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_60);
  local_78 = sysbvm_context_shallowCopy(context,*arguments);
  sVar1 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  *(sysbvm_tuple_t *)(local_78 + 0x18) = sVar1;
  sStack_70 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                        (context,*(sysbvm_tuple_t *)(local_78 + 0x28),0,arguments[1]);
  *(sysbvm_tuple_t *)(local_78 + 0x28) = sStack_70;
  if (*(sysbvm_tuple_t *)(local_78 + 0x30) != 0) {
    local_68 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                         (context,*(sysbvm_tuple_t *)(local_78 + 0x30),0,arguments[1]);
    *(sysbvm_tuple_t *)(local_78 + 0x30) = local_68;
  }
  *(sysbvm_tuple_t *)(local_78 + 0x20) = (context->roots).associationType;
  sysbvm_stackFrame_popRecord(&local_60);
  sysbvm_stackFrame_popRecord(&local_48);
  return local_78;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMakeAssociationNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astMakeAssociationNode_t **associationNode = (sysbvm_astMakeAssociationNode_t**)node;

    struct {
        sysbvm_astMakeAssociationNode_t *analyzedAssociationNode;
        sysbvm_tuple_t analyzedKey;
        sysbvm_tuple_t analyzedValue;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*associationNode)->super.sourcePosition);

    gcFrame.analyzedAssociationNode = (sysbvm_astMakeAssociationNode_t *)sysbvm_context_shallowCopy(context, *node);
    gcFrame.analyzedAssociationNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    gcFrame.analyzedKey = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.analyzedAssociationNode->key, *environment);
    gcFrame.analyzedAssociationNode->key = gcFrame.analyzedKey;
    if(gcFrame.analyzedAssociationNode->value)
    {
        gcFrame.analyzedValue = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.analyzedAssociationNode->value, *environment);
        gcFrame.analyzedAssociationNode->value = gcFrame.analyzedValue;
    }

    gcFrame.analyzedAssociationNode->super.analyzedType = context->roots.associationType;
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.analyzedAssociationNode;
}